

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O2

bool __thiscall xmrig::OclThread::isEqual(OclThread *this,OclThread *other)

{
  long *__last1;
  __equal<true> *this_00;
  long *__first1;
  bool bVar1;
  long *__first2;
  
  __last1 = (other->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (__equal<true> *)
            (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  __first1 = (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  __first2 = (long *)((long)__first1 - (long)this_00);
  if (((((((long *)((long)(other->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)__last1) == __first2) &&
         (bVar1 = std::__equal<true>::equal<long>(this_00,__first1,__last1,__first2), bVar1)) &&
        (other->m_bfactor == this->m_bfactor)) &&
       ((other->m_datasetHost == this->m_datasetHost && (other->m_gcnAsm == this->m_gcnAsm)))) &&
      ((other->m_index == this->m_index &&
       ((other->m_intensity == this->m_intensity && (other->m_memChunk == this->m_memChunk)))))) &&
     ((other->m_stridedIndex == this->m_stridedIndex &&
      (other->m_unrollFactor == this->m_unrollFactor)))) {
    return other->m_worksize == this->m_worksize;
  }
  return false;
}

Assistant:

bool xmrig::OclThread::isEqual(const OclThread &other) const
{
    return other.m_threads.size() == m_threads.size() &&
           std::equal(m_threads.begin(), m_threads.end(), other.m_threads.begin()) &&
           other.m_bfactor      == m_bfactor &&
           other.m_datasetHost  == m_datasetHost &&
           other.m_gcnAsm       == m_gcnAsm &&
           other.m_index        == m_index &&
           other.m_intensity    == m_intensity &&
           other.m_memChunk     == m_memChunk &&
           other.m_stridedIndex == m_stridedIndex &&
           other.m_unrollFactor == m_unrollFactor &&
           other.m_worksize     == m_worksize;
}